

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::SkipMessage(CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  WireType WVar3;
  WireType wire_type;
  uint32 tag;
  CodedInputStream *input_local;
  uint32 local_c;
  
  do {
    if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
      input->last_tag_ = (uint)*input->buffer_;
      io::CodedInputStream::Advance(input,1);
      local_c = input->last_tag_;
    }
    else {
      uVar2 = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = uVar2;
      local_c = input->last_tag_;
    }
    if (local_c == 0) {
      return true;
    }
    WVar3 = GetTagWireType(local_c);
    if (WVar3 == WIRETYPE_END_GROUP) {
      return true;
    }
    bVar1 = SkipField(input,local_c);
  } while (bVar1);
  return false;
}

Assistant:

bool WireFormatLite::SkipMessage(io::CodedInputStream* input) {
  while(true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP) {
      // Must be the end of the message.
      return true;
    }

    if (!SkipField(input, tag)) return false;
  }
}